

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_decl_align(CPState *cp,CPDecl *decl)

{
  CTSize CVar1;
  uint local_20;
  uint local_1c;
  CTSize al;
  CPDecl *decl_local;
  CPState *cp_local;
  
  local_1c = 4;
  if (cp->tok == 0x28) {
    CVar1 = cp_decl_sizeattr(cp);
    if (CVar1 == 0) {
      local_20 = 0;
    }
    else {
      local_20 = 0x1f;
      if (CVar1 != 0) {
        for (; CVar1 >> local_20 == 0; local_20 = local_20 - 1) {
        }
      }
    }
    local_1c = local_20;
  }
  decl->attr = decl->attr & 0xfff0ffff | (local_1c & 0xf) << 0x10;
  decl->attr = decl->attr | 1;
  return;
}

Assistant:

static void cp_decl_align(CPState *cp, CPDecl *decl)
{
  CTSize al = 4;  /* Unspecified alignment is 16 bytes. */
  if (cp->tok == '(') {
    al = cp_decl_sizeattr(cp);
    al = al ? lj_fls(al) : 0;
  }
  CTF_INSERT(decl->attr, ALIGN, al);
  decl->attr |= CTFP_ALIGNED;
}